

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O3

void MyGame_Example_Monster_sort(MyGame_Example_Monster_mutable_table_t t)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  MyGame_Example_Monster_mutable_table_t pMVar6;
  ulong uVar7;
  MyGame_Example_Any_mutable_union_t u;
  
  if (t != (MyGame_Example_Monster_mutable_table_t)0x0) {
    do {
      if (*(ushort *)(t + -(long)*(int *)t) < 0x14) {
LAB_0010b9a4:
        bVar3 = 0;
LAB_0010b9a6:
        pMVar6 = (MyGame_Example_Monster_mutable_table_t)0x0;
      }
      else {
        lVar5 = -(long)*(int *)t;
        if (((ulong)*(ushort *)(t + lVar5 + 0x12) == 0) ||
           (bVar3 = t[*(ushort *)(t + lVar5 + 0x12)].unused__, bVar3 == 0)) goto LAB_0010b9a4;
        if ((*(ushort *)(t + -(long)*(int *)t) < 0x16) ||
           (uVar4 = (ulong)*(ushort *)(t + lVar5 + 0x14), uVar4 == 0)) goto LAB_0010b9a6;
        pMVar6 = t + *(uint *)(t + uVar4) + uVar4;
      }
      u._1_7_ = 0;
      u.type = bVar3;
      u.value = pMVar6;
      MyGame_Example_Any_sort(u);
      lVar5 = -(long)*(int *)t;
      if ((0x1b < *(ushort *)(t + -(long)*(int *)t)) &&
         (uVar4 = (ulong)*(ushort *)(t + lVar5 + 0x1a), uVar4 != 0)) {
        uVar1 = *(uint *)(t + uVar4);
        uVar2 = *(uint *)(t + uVar1 + uVar4);
        if ((ulong)uVar2 != 0) {
          uVar7 = 0;
          pMVar6 = t + uVar1 + uVar4;
          do {
            pMVar6 = pMVar6 + 4;
            if (*(uint *)(t + uVar1 + uVar4) <= uVar7) {
              __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                            ,0x43a,
                            "MyGame_Example_Monster_table_t MyGame_Example_Monster_vec_at(MyGame_Example_Monster_vec_t, size_t)"
                           );
            }
            MyGame_Example_Monster_sort(pMVar6 + *(uint *)pMVar6);
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
          lVar5 = -(long)*(int *)t;
        }
      }
      if ((*(ushort *)(t + lVar5) < 0x1e) ||
         (uVar4 = (ulong)*(ushort *)(t + lVar5 + 0x1c), uVar4 == 0)) {
        t = (MyGame_Example_Monster_mutable_table_t)0x0;
      }
      else {
        t = t + *(uint *)(t + uVar4) + uVar4;
      }
    } while (t != (MyGame_Example_Monster_mutable_table_t)0x0);
  }
  return;
}

Assistant:

static void MyGame_Example_Monster_sort(MyGame_Example_Monster_mutable_table_t t)
{
    if (!t) return;
    __flatbuffers_sort_union_field(MyGame_Example_Monster, test, MyGame_Example_Any, t);
    __flatbuffers_sort_table_vector_field_elements(MyGame_Example_Monster, testarrayoftables, MyGame_Example_Monster, t);
    __flatbuffers_sort_table_field(MyGame_Example_Monster, enemy, MyGame_Example_Monster, t);
}